

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLgraph.c
# Opt level: O0

uint RDL_addUEdge_g(RDL_graph *gra,uint from,uint to)

{
  uint local_28;
  uint i;
  uint edge_id;
  uint to_local;
  uint from_local;
  RDL_graph *gra_local;
  
  if ((from < gra->V) && (to < gra->V)) {
    if (from == to) {
      (*RDL_outputFunc)(RDL_WARNING,"Adding a loop is not allowed, node %u\n",(ulong)from);
      gra_local._4_4_ = 0xffffffff;
    }
    else {
      for (local_28 = 0; local_28 < gra->degree[from]; local_28 = local_28 + 1) {
        if (gra->adjList[from][local_28][0] == to) {
          return 0xfffffffe;
        }
      }
      RDL_addEdge(gra,from,to);
      RDL_addEdge(gra,to,from);
      gra->E = gra->E - 1;
      gra_local._4_4_ = RDL_addToEdgeArray(gra,from,to);
      gra->adjList[from][gra->degree[from] - 1][1] = gra_local._4_4_;
      gra->adjList[to][gra->degree[to] - 1][1] = gra_local._4_4_;
    }
  }
  else {
    (*RDL_outputFunc)(RDL_ERROR,"Tried to add an edge with atoms not in range.\n");
    (*RDL_outputFunc)(RDL_ERROR,"edge (%u,%u) can not be added to graph with %u atoms.\n",
                      (ulong)from,(ulong)to,(ulong)gra->V);
    gra_local._4_4_ = 0xffffffff;
  }
  return gra_local._4_4_;
}

Assistant:

unsigned RDL_addUEdge_g(RDL_graph *gra, unsigned from, unsigned to)
{
  unsigned edge_id, i;

  if(from >= gra->V || to >= gra->V) {
    RDL_outputFunc(RDL_ERROR, "Tried to add an edge with atoms not in range.\n");
    RDL_outputFunc(RDL_ERROR,  "edge (%u,%u) can not be added to graph with %u atoms.\n",
        from, to, gra->V);
    return RDL_INVALID_RESULT;
  }

  if (from == to) {
    RDL_outputFunc(RDL_WARNING, "Adding a loop is not allowed, node %u\n", from);
    return RDL_INVALID_RESULT;
  }

  for(i=0; i<gra->degree[from]; ++i) {
    if(gra->adjList[from][i][0] == to) {
      /*edge already exists*/
      return RDL_DUPLICATE_EDGE;
    }
  }
  RDL_addEdge(gra, from, to);
  RDL_addEdge(gra, to, from);
  --gra->E; /*was incremented twice*/

  edge_id = RDL_addToEdgeArray(gra, from, to);

  gra->adjList[from][gra->degree[from]-1][1] = edge_id;
  gra->adjList[to][gra->degree[to]-1][1] = edge_id;

  return edge_id;
}